

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatasetBuilder.cpp
# Opt level: O3

void __thiscall DatasetBuilder::force_registered(DatasetBuilder *this,string *filepath)

{
  pointer pbVar1;
  size_t __n;
  int iVar2;
  
  pbVar1 = (this->fids).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((this->fids).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start != pbVar1) &&
     (__n = pbVar1[-1]._M_string_length, __n == filepath->_M_string_length)) {
    if (__n != 0) {
      iVar2 = bcmp(pbVar1[-1]._M_dataplus._M_p,(filepath->_M_dataplus)._M_p,__n);
      if (iVar2 != 0) goto LAB_00164a8f;
    }
    return;
  }
LAB_00164a8f:
  register_fname(this,filepath);
  return;
}

Assistant:

void DatasetBuilder::force_registered(const std::string &filepath) {
    if (!fids.empty()) {
        if (fids.back() == filepath) {
            return;
        }
    }

    register_fname(filepath);
}